

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O3

void __thiscall remote::Module::CacheSymbolData64(Module *this,void *buffer)

{
  Elf64_Word EVar1;
  Elf64_Phdr *pEVar2;
  ostream *poVar3;
  Elf64_Shdr *pEVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  size_t index;
  string attrString;
  char *local_58;
  long local_50;
  char local_48 [16];
  size_t local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CacheSymbolData64",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_38 = elf::arch64::GetProgramHeaderEntryCount(buffer);
  if (local_38 != 0) {
    sVar7 = 0;
    do {
      pEVar2 = elf::arch64::GetProgramHeaderEntry(buffer,sVar7);
      if (pEVar2 != (Elf64_Phdr *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Prog: ",6);
        *(uint *)(process_vm_readv + *(long *)(std::cout + -0x18)) =
             *(uint *)(process_vm_readv + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        EVar1 = pEVar2->p_type;
        if ((int)EVar1 < 0x60000000) {
          switch(EVar1) {
          case 0:
            lVar5 = 9;
            pcVar6 = "[PT_NULL]";
            break;
          case 1:
            lVar5 = 9;
            pcVar6 = "[PT_LOAD]";
            break;
          case 2:
            lVar5 = 0xc;
            pcVar6 = "[PT_DYNAMIC]";
            break;
          case 3:
            lVar5 = 0xb;
            pcVar6 = "[PT_INTERP]";
            break;
          case 4:
            lVar5 = 9;
            pcVar6 = "[PT_NOTE]";
            break;
          case 5:
            lVar5 = 10;
            pcVar6 = "[PT_SHLIB]";
            break;
          case 6:
            lVar5 = 9;
            pcVar6 = "[PT_PHDR]";
            break;
          case 7:
            lVar5 = 8;
            pcVar6 = "[PT_TLS]";
            break;
          default:
            goto switchD_001069eb_default;
          }
          goto LAB_00106ba0;
        }
        if ((int)EVar1 < 0x6474e552) {
          if (EVar1 == 0x60000000) {
            lVar5 = 9;
            pcVar6 = "[PT_LOOS]";
          }
          else {
            if (EVar1 != 0x6474e550) {
              if (EVar1 != 0x6474e551) goto switchD_001069eb_default;
              lVar5 = 0xe;
              pcVar6 = "[PT_GNU_STACK]";
              goto LAB_00106ba0;
            }
            lVar5 = 0x11;
            pcVar6 = "[PT_GNU_EH_FRAME]";
          }
LAB_00106b83:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
        }
        else {
          if ((int)EVar1 < 0x70000000) {
            if (EVar1 == 0x6474e552) {
              lVar5 = 0xe;
              pcVar6 = "[PT_GNU_RELRO]";
              goto LAB_00106b83;
            }
            if (EVar1 == 0x6fffffff) {
              lVar5 = 9;
              pcVar6 = "[PT_HIOS]";
            }
            else {
switchD_001069eb_default:
              lVar5 = 9;
              pcVar6 = "[Default]";
            }
          }
          else {
            if (EVar1 == 0x70000000) {
              lVar5 = 0xb;
              pcVar6 = "[PT_LOPROC]";
              goto LAB_00106b83;
            }
            if (EVar1 != 0x7fffffff) goto switchD_001069eb_default;
            lVar5 = 0xb;
            pcVar6 = "[PT_HIPROC]";
          }
LAB_00106ba0:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        local_50 = 0;
        local_48[0] = '\0';
        local_58 = local_48;
        std::__cxx11::string::append((char *)&local_58);
        std::__cxx11::string::append((char *)&local_58);
        std::__cxx11::string::append((char *)&local_58);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_58,local_50);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (local_58 != local_48) {
          operator_delete(local_58);
        }
      }
      sVar7 = sVar7 + 1;
    } while (local_38 != sVar7);
  }
  sVar7 = elf::arch64::GetSectionHeaderEntryCount(buffer);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Section Count: ",0xf);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (sVar7 != 0) {
    index = 0;
    do {
      pEVar4 = elf::arch64::GetSectionHeaderEntry(buffer,index);
      if (pEVar4 != (Elf64_Shdr *)0x0) {
        EVar1 = pEVar4->sh_type;
        if (EVar1 == 9) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Section [",9);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]: ",3);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          lVar5 = 8;
          pcVar6 = " - REL (";
        }
        else if (EVar1 == 3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Section [",9);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]: ",3);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          lVar5 = 0xb;
          pcVar6 = " - STRTAB (";
        }
        else {
          if (EVar1 != 2) goto LAB_00106ee5;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Section [",9);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]: ",3);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          lVar5 = 0xb;
          pcVar6 = " - SYMTAB (";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
LAB_00106ee5:
      index = index + 1;
    } while (sVar7 != index);
  }
  return;
}

Assistant:

void remote::Module::CacheSymbolData64(void* buffer) {
    std::cout << "CacheSymbolData64" << std::endl;

    size_t programCount = elf::arch64::GetProgramHeaderEntryCount(buffer);

    for(size_t i = 0; i < programCount; ++i) {
        Elf64_Phdr *prog = elf::arch64::GetProgramHeaderEntry(buffer, i);

        if (!prog)
            continue;

        std::cout << "Prog: " << std::hex << prog->p_offset << ":" << prog->p_paddr << ":" << prog->p_vaddr << ":" << prog->p_type << ":" << prog->p_flags << std::endl;

        switch (prog->p_type) {
            case PT_NULL:
                std::cout << "[PT_NULL]" << std::endl;
                break;
            case PT_LOAD:
                std::cout << "[PT_LOAD]" << std::endl;
                break;
            case PT_DYNAMIC:
                std::cout << "[PT_DYNAMIC]" << std::endl;
                break;
            case PT_INTERP:
                std::cout << "[PT_INTERP]" << std::endl;
                break;
            case PT_NOTE:
                std::cout << "[PT_NOTE]" << std::endl;
                break;
            case PT_SHLIB:
                std::cout << "[PT_SHLIB]" << std::endl;
                break;
            case PT_PHDR:
                std::cout << "[PT_PHDR]" << std::endl;
                break;
            case PT_TLS:
                std::cout << "[PT_TLS]" << std::endl;
                break;
            case PT_LOOS:
                std::cout << "[PT_LOOS]" << std::endl;
                break;
            case PT_HIOS:
                std::cout << "[PT_HIOS]" << std::endl;
                break;
            case PT_LOPROC:
                std::cout << "[PT_LOPROC]" << std::endl;
                break;
            case PT_HIPROC:
                std::cout << "[PT_HIPROC]" << std::endl;
                break;
            case PT_GNU_EH_FRAME:
                std::cout << "[PT_GNU_EH_FRAME]" << std::endl;
                break;
            case PT_GNU_STACK:
                std::cout << "[PT_GNU_STACK]" << std::endl;
                break;
            case PT_GNU_RELRO:
                std::cout << "[PT_GNU_RELRO]" << std::endl;
                break;
            default:
                std::cout << "[Default]" << std::endl;
                break;
        }

        std::string attrString;

        attrString.append((prog->p_flags & PF_R) ? "r" : "-");
        attrString.append((prog->p_flags & PF_W) ? "w" : "-");
        attrString.append((prog->p_flags & PF_X) ? "x" : "-");

        std::cout << attrString << std::endl;
    }

    size_t sectionCount = elf::arch64::GetSectionHeaderEntryCount(buffer);

    std::cout << "Section Count: " << sectionCount << std::endl;

    for(size_t i = 0; i < sectionCount; i++) {
        Elf64_Shdr* sec = elf::arch64::GetSectionHeaderEntry(buffer, i);

        if(!sec)
            continue;

        switch(sec->sh_type) {
            case SHT_SYMTAB:
                std::cout << "Section [" << i << "]: " << sec->sh_offset << " - " << sec->sh_addr << " - SYMTAB (" << sec->sh_type << ")" << std::endl;
                break;
            case SHT_STRTAB:
                std::cout << "Section [" << i << "]: " << sec->sh_offset << " - " << sec->sh_addr << " - STRTAB (" << sec->sh_type << ")" << std::endl;
                break;
            case SHT_REL:
                std::cout << "Section [" << i << "]: " << sec->sh_offset << " - " << sec->sh_addr << " - REL (" << sec->sh_type << ")" << std::endl;
                break;
        }

        /*
        const char* name = elf::arch64::GetNameOfSectionAtIndex(buffer, sec);

        if(!name)
            continue;

        std::cout << "Section: " << name << std::endl;*/
    }
}